

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_brusselator1D_imexmri.c
# Opt level: O2

int ff(sunrealtype t,N_Vector y,N_Vector ydot,void *user_data)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  void *returnvalue;
  undefined8 *returnvalue_00;
  long lVar8;
  long lVar9;
  int iVar10;
  long lVar11;
  double dVar12;
  
  lVar11 = *user_data;
  dVar2 = *(double *)((long)user_data + 0x10);
  dVar3 = *(double *)((long)user_data + 0x18);
  dVar4 = *(double *)((long)user_data + 0x58);
  returnvalue = (void *)N_VGetArrayPointer();
  iVar7 = check_retval(returnvalue,"N_VGetArrayPointer",0);
  iVar10 = 1;
  if (iVar7 == 0) {
    returnvalue_00 = (undefined8 *)N_VGetArrayPointer(ydot);
    iVar7 = check_retval(returnvalue_00,"N_VGetArrayPointer",0);
    if (iVar7 == 0) {
      N_VConst(0,ydot);
      lVar11 = lVar11 + -1;
      lVar9 = 0x28;
      for (lVar8 = 1; lVar8 < lVar11; lVar8 = lVar8 + 1) {
        pdVar1 = (double *)((long)returnvalue + lVar9 + -0x10);
        dVar6 = *pdVar1;
        dVar5 = *(double *)((long)returnvalue + lVar9);
        dVar12 = pdVar1[1] * dVar6;
        pdVar1 = (double *)((long)returnvalue_00 + lVar9 + -0x10);
        *pdVar1 = dVar6 * dVar12 + (dVar2 - (dVar5 + 1.0) * dVar6);
        pdVar1[1] = dVar6 * dVar5 + -dVar12 * dVar6;
        *(double *)((long)returnvalue_00 + lVar9) = (dVar3 - dVar5) / dVar4 - dVar5 * dVar6;
        lVar9 = lVar9 + 0x18;
      }
      *returnvalue_00 = 0;
      returnvalue_00[1] = 0;
      returnvalue_00[2] = 0;
      returnvalue_00[lVar11 * 3] = 0;
      (returnvalue_00 + lVar11 * 3)[1] = 0;
      returnvalue_00[lVar11 * 3 + 2] = 0;
      iVar10 = 0;
    }
  }
  return iVar10;
}

Assistant:

static int ff(sunrealtype t, N_Vector y, N_Vector ydot, void* user_data)
{
  UserData udata     = (UserData)user_data; /* access problem data */
  sunindextype N     = udata->N;            /* set variable shortcuts */
  sunrealtype a      = udata->a;
  sunrealtype b      = udata->b;
  sunrealtype ep     = udata->ep;
  sunrealtype *Ydata = NULL, *dYdata = NULL;
  sunrealtype u, v, w;
  sunindextype i;

  Ydata = N_VGetArrayPointer(y); /* access data arrays */
  if (check_retval((void*)Ydata, "N_VGetArrayPointer", 0)) { return 1; }
  dYdata = N_VGetArrayPointer(ydot);
  if (check_retval((void*)dYdata, "N_VGetArrayPointer", 0)) { return 1; }
  N_VConst(0.0, ydot); /* initialize ydot to zero */

  /* iterate over domain, computing all equations */
  for (i = 1; i < N - 1; i++)
  {
    /* set shortcuts */
    u = Ydata[IDX(i, 0)];
    v = Ydata[IDX(i, 1)];
    w = Ydata[IDX(i, 2)];

    /* Fill in ODE RHS for u */
    dYdata[IDX(i, 0)] = a - (w + ONE) * u + v * u * u;

    /* Fill in ODE RHS for v */
    dYdata[IDX(i, 1)] = w * u - v * u * u;

    /* Fill in ODE RHS for w */
    dYdata[IDX(i, 2)] = (b - w) / ep - w * u;
  }

  /* enforce stationary boundaries */
  dYdata[IDX(0, 0)] = dYdata[IDX(0, 1)] = dYdata[IDX(0, 2)] = 0.0;
  dYdata[IDX(N - 1, 0)] = dYdata[IDX(N - 1, 1)] = dYdata[IDX(N - 1, 2)] = 0.0;

  /* Return with success */
  return 0;
}